

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_lsa(DisasContext_conflict6 *ctx,int opc,int rd,int rs,int rt,int imm2)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o_1;
  uintptr_t o;
  
  if (rd != 0) {
    tcg_ctx = ctx->uc->tcg_ctx;
    t = tcg_temp_new_i64(tcg_ctx);
    t_00 = tcg_temp_new_i64(tcg_ctx);
    gen_load_gpr(tcg_ctx,t,rs);
    gen_load_gpr(tcg_ctx,t_00,rt);
    tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,(ulong)(imm2 + 1));
    tcg_gen_add_i64(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t,t_00);
    if (opc == 5) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],tcg_ctx->cpu_gpr[(uint)rd]);
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_lsa(DisasContext *ctx, int opc, int rd, int rs, int rt,
                    int imm2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv t1;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);
    tcg_gen_shli_tl(tcg_ctx, t0, t0, imm2 + 1);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0, t1);
    if (opc == OPC_LSA) {
        tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rd]);
    }

    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);

    return;
}